

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O0

GlobalGet * __thiscall MixedArena::alloc<wasm::GlobalGet>(MixedArena *this)

{
  GlobalGet *this_00;
  GlobalGet *ret;
  MixedArena *this_local;
  
  this_00 = (GlobalGet *)allocSpace(this,0x20,8);
  wasm::GlobalGet::GlobalGet(this_00,this);
  return this_00;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }